

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

stat * tree_current_lstat(tree *t)

{
  int iVar1;
  
  if ((t->flags & 0x20) == 0) {
    iVar1 = fstatat(t->working_dir_fd,t->basename,(stat *)&t->lst,0x100);
    if (iVar1 != 0) {
      return (stat *)0x0;
    }
    *(byte *)&t->flags = (byte)t->flags | 0x20;
  }
  return &t->lst;
}

Assistant:

static const struct stat *
tree_current_lstat(struct tree *t)
{
	if (!(t->flags & hasLstat)) {
#ifdef HAVE_FSTATAT
		if (fstatat(tree_current_dir_fd(t),
		    tree_current_access_path(t), &t->lst,
		    AT_SYMLINK_NOFOLLOW) != 0)
#else
		if (tree_enter_working_dir(t) != 0)
			return NULL;
		if (lstat(tree_current_access_path(t), &t->lst) != 0)
#endif
			return NULL;
		t->flags |= hasLstat;
	}
	return (&t->lst);
}